

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool gpt_params_parse(int argc,char **argv,gpt_params *params)

{
  bool bVar1;
  _Alloc_hider _Var2;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined8 extraout_RAX;
  int iVar6;
  float fVar8;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  string arg;
  ifstream file;
  int local_2bc;
  string local_2b8;
  string *local_298 [2];
  string local_288;
  string *local_268;
  string *local_260;
  string local_258;
  long local_238 [4];
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  string **ppsVar7;
  
  local_2bc = 1;
  if (1 < argc) {
    local_268 = (string *)&params->token_test;
    local_288.field_2._8_8_ = &params->prompt;
    local_260 = (string *)&params->model;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_298,argv[local_2bc],(allocator<char> *)&local_2b8);
      iVar3 = std::__cxx11::string::compare((char *)local_298);
      if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 != 0)) {
        iVar3 = std::__cxx11::string::compare((char *)local_298);
        if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0))
        {
          get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
          _Var2._M_p = local_2b8._M_dataplus._M_p;
          piVar4 = __errno_location();
          iVar3 = *piVar4;
          *piVar4 = 0;
          lVar5 = strtol(_Var2._M_p,(char **)&local_288.field_2._M_allocated_capacity,10);
          if ((pointer)local_288.field_2._M_allocated_capacity != _Var2._M_p) {
            if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar4 != 0x22)) {
              if (*piVar4 == 0) {
                *piVar4 = iVar3;
              }
              params->n_threads = (int32_t)lVar5;
              goto LAB_0010cd2c;
            }
            goto LAB_0010d212;
          }
          goto LAB_0010d21e;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_298);
        if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0))
        {
          get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
          std::__cxx11::string::operator=((string *)local_288.field_2._8_8_,(string *)&local_2b8);
          goto LAB_0010cdb3;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_298);
        if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0))
        {
          get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
          _Var2._M_p = local_2b8._M_dataplus._M_p;
          piVar4 = __errno_location();
          iVar3 = *piVar4;
          *piVar4 = 0;
          lVar5 = strtol(_Var2._M_p,(char **)&local_288.field_2._M_allocated_capacity,10);
          if ((pointer)local_288.field_2._M_allocated_capacity != _Var2._M_p) {
            if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar4 != 0x22)) {
              if (*piVar4 == 0) {
                *piVar4 = iVar3;
              }
              params->n_predict = (int32_t)lVar5;
              goto LAB_0010cd2c;
            }
            goto LAB_0010d22a;
          }
          goto LAB_0010d236;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_298);
        if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 != 0))
        {
          iVar3 = std::__cxx11::string::compare((char *)local_298);
          if (iVar3 == 0) {
            get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
            iVar3 = std::__cxx11::stoi(&local_2b8,(size_t *)0x0,10);
            params->top_k = iVar3;
LAB_0010cdb3:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)local_298);
            if (iVar3 == 0) {
              get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
              fVar8 = std::__cxx11::stof(&local_2b8,(size_t *)0x0);
              params->top_p = fVar8;
              goto LAB_0010cdb3;
            }
            iVar3 = std::__cxx11::string::compare((char *)local_298);
            if (iVar3 == 0) {
              get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
              fVar8 = std::__cxx11::stof(&local_2b8,(size_t *)0x0);
              params->temp = fVar8;
              goto LAB_0010cdb3;
            }
            iVar3 = std::__cxx11::string::compare((char *)local_298);
            if (iVar3 == 0) {
              get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
              iVar3 = std::__cxx11::stoi(&local_2b8,(size_t *)0x0,10);
              params->repeat_last_n = iVar3;
              goto LAB_0010cdb3;
            }
            iVar3 = std::__cxx11::string::compare((char *)local_298);
            if (iVar3 == 0) {
              get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
              fVar8 = std::__cxx11::stof(&local_2b8,(size_t *)0x0);
              params->repeat_penalty = fVar8;
              goto LAB_0010cdb3;
            }
            iVar3 = std::__cxx11::string::compare((char *)local_298);
            if ((iVar3 == 0) ||
               (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0)) {
              get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
              iVar3 = std::__cxx11::stoi(&local_2b8,(size_t *)0x0,10);
              params->n_batch = iVar3;
              goto LAB_0010cdb3;
            }
            iVar3 = std::__cxx11::string::compare((char *)local_298);
            if ((iVar3 == 0) ||
               (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0)) {
              get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
              iVar3 = std::__cxx11::stoi(&local_2b8,(size_t *)0x0,10);
              params->n_ctx = iVar3;
              goto LAB_0010cdb3;
            }
            iVar3 = std::__cxx11::string::compare((char *)local_298);
            if (((iVar3 == 0) ||
                (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0)) ||
               (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0)) {
              get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
              iVar3 = std::__cxx11::stoi(&local_2b8,(size_t *)0x0,10);
              params->n_gpu_layers = iVar3;
              goto LAB_0010cdb3;
            }
            iVar3 = std::__cxx11::string::compare((char *)local_298);
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::string::compare((char *)local_298);
              if ((iVar3 == 0) ||
                 (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0)) {
                get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
                std::__cxx11::string::operator=(local_260,(string *)&local_2b8);
                goto LAB_0010cd2c;
              }
              iVar3 = std::__cxx11::string::compare((char *)local_298);
              if ((iVar3 == 0) ||
                 (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0)) {
                params->interactive = true;
                bVar1 = true;
                goto LAB_0010cd50;
              }
              iVar3 = std::__cxx11::string::compare((char *)local_298);
              if ((iVar3 == 0) ||
                 (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 == 0)) {
                params->interactive = true;
                get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
                iVar3 = std::__cxx11::stoi(&local_2b8,(size_t *)0x0,10);
                params->interactive_port = iVar3;
LAB_0010d0e6:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                  operator_delete(local_2b8._M_dataplus._M_p,
                                  local_2b8.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                ppsVar7 = local_298;
                iVar3 = std::__cxx11::string::compare((char *)ppsVar7);
                iVar6 = (int)ppsVar7;
                if (iVar3 == 0) goto LAB_0010d25a;
                ppsVar7 = local_298;
                iVar3 = std::__cxx11::string::compare((char *)ppsVar7);
                iVar6 = (int)ppsVar7;
                if (iVar3 == 0) goto LAB_0010d25a;
                iVar3 = std::__cxx11::string::compare((char *)local_298);
                if ((iVar3 != 0) &&
                   (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 != 0)) {
                  iVar3 = std::__cxx11::string::compare((char *)local_298);
                  if ((iVar3 != 0) &&
                     (iVar3 = std::__cxx11::string::compare((char *)local_298), iVar3 != 0)) {
                    gpt_params_parse();
                    std::ifstream::~ifstream(local_238);
                    if (local_298[0] != &local_288) {
                      operator_delete(local_298[0],(ulong)(local_288._M_dataplus._M_p + 1));
                    }
                    _Unwind_Resume(extraout_RAX);
                  }
                  get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
                  std::__cxx11::string::operator=(local_268,(string *)&local_2b8);
                  goto LAB_0010d0e6;
                }
                get_next_arg(&local_258,&local_2bc,argc,argv,local_298[0],params);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
                std::ifstream::ifstream(local_238,argv[local_2bc],_S_in);
                if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
                  gpt_params_parse();
                  bVar1 = false;
                  goto LAB_0010cd50;
                }
                __first._8_8_ = 0xffffffff;
                __first._M_sbuf =
                     *(streambuf_type **)((long)auStack_150 + *(long *)(local_238[0] + -0x18));
                std::__copy_move<false,false,std::input_iterator_tag>::
                __copy_m<std::istreambuf_iterator<char,std::char_traits<char>>,std::back_insert_iterator<std::__cxx11::string>>
                          (__first,(istreambuf_iterator<char,_std::char_traits<char>_>)
                                   (ZEXT816(0xffffffff) << 0x40),
                           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_288.field_2._8_8_);
                if ((params->prompt)._M_dataplus._M_p[(params->prompt)._M_string_length - 1] == '\n'
                   ) {
                  std::__cxx11::string::pop_back();
                }
                std::ifstream::~ifstream(local_238);
              }
              bVar1 = true;
              goto LAB_0010cd50;
            }
            params->ignore_eos = true;
          }
          bVar1 = true;
          goto LAB_0010cd50;
        }
        get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
        _Var2._M_p = local_2b8._M_dataplus._M_p;
        piVar4 = __errno_location();
        iVar3 = *piVar4;
        *piVar4 = 0;
        lVar5 = strtol(_Var2._M_p,(char **)&local_288.field_2._M_allocated_capacity,10);
        if ((pointer)local_288.field_2._M_allocated_capacity != _Var2._M_p) {
          if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar4 != 0x22)) {
            if (*piVar4 == 0) {
              *piVar4 = iVar3;
            }
            params->n_parallel = (int32_t)lVar5;
            goto LAB_0010cd2c;
          }
          goto LAB_0010d242;
        }
LAB_0010d24e:
        iVar6 = 0x1211ad;
        std::__throw_invalid_argument("stoi");
LAB_0010d25a:
        gpt_print_usage(iVar6,argv,params);
        exit(0);
      }
      get_next_arg(&local_2b8,&local_2bc,argc,argv,local_298[0],params);
      _Var2._M_p = local_2b8._M_dataplus._M_p;
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      *piVar4 = 0;
      lVar5 = strtol(_Var2._M_p,(char **)&local_288.field_2._M_allocated_capacity,10);
      if ((pointer)local_288.field_2._M_allocated_capacity == _Var2._M_p) {
        std::__throw_invalid_argument("stoi");
LAB_0010d206:
        std::__throw_out_of_range("stoi");
LAB_0010d212:
        std::__throw_out_of_range("stoi");
LAB_0010d21e:
        std::__throw_invalid_argument("stoi");
LAB_0010d22a:
        std::__throw_out_of_range("stoi");
LAB_0010d236:
        std::__throw_invalid_argument("stoi");
LAB_0010d242:
        std::__throw_out_of_range("stoi");
        goto LAB_0010d24e;
      }
      if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0010d206;
      if (*piVar4 == 0) {
        *piVar4 = iVar3;
      }
      params->seed = (int32_t)lVar5;
LAB_0010cd2c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      bVar1 = true;
LAB_0010cd50:
      if (local_298[0] != &local_288) {
        operator_delete(local_298[0],(ulong)(local_288._M_dataplus._M_p + 1));
      }
    } while ((bVar1) && (local_2bc = local_2bc + 1, local_2bc < argc));
  }
  return true;
}

Assistant:

bool gpt_params_parse(int argc, char ** argv, gpt_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-s" || arg == "--seed") {
            params.seed = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-t" || arg == "--threads") {
            params.n_threads = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-p" || arg == "--prompt") {
            params.prompt = get_next_arg(i, argc, argv, arg, params);
        } else if (arg == "-n" || arg == "--n_predict") {
            params.n_predict = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-np" || arg == "--n_parallel") {
            params.n_parallel = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--top_k") {
            params.top_k = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--top_p") {
            params.top_p = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--temp") {
            params.temp = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--repeat-last-n") {
            params.repeat_last_n = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--repeat-penalty") {
            params.repeat_penalty = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-b" || arg == "--batch_size") {
            params.n_batch= std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-c" || arg == "--context") {
            params.n_ctx= std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-ngl" || arg == "--gpu-layers" || arg == "--n-gpu-layers") {
            params.n_gpu_layers = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--ignore-eos") {
            params.ignore_eos = true;
        } else if (arg == "-m" || arg == "--model") {
            params.model = get_next_arg(i, argc, argv, arg, params);
        } else if (arg == "-i" || arg == "--interactive") {
            params.interactive = true;
        } else if (arg == "-ip" || arg == "--interactive-port") {
            params.interactive = true;
            params.interactive_port = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-h" || arg == "--help") {
            gpt_print_usage(argc, argv, params);
            exit(0);
        } else if (arg == "-f" || arg == "--file") {
            get_next_arg(i, argc, argv, arg, params);
            std::ifstream file(argv[i]);
            if (!file) {
                fprintf(stderr, "error: failed to open file '%s'\n", argv[i]);
                break;
            }
            std::copy(std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>(), back_inserter(params.prompt));
            if (params.prompt.back() == '\n') {
                params.prompt.pop_back();
            }
        } else if (arg == "-tt" || arg == "--token_test") {
            params.token_test = get_next_arg(i, argc, argv, arg, params);
        }
        else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            gpt_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}